

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacketbuilder.h
# Opt level: O0

size_t __thiscall
jrtplib::RTCPCompoundPacketBuilder::SDES::NeededBytesWithExtraItem
          (SDES *this,uint8_t itemdatalength)

{
  bool bVar1;
  reference ppSVar2;
  size_t sVar3;
  size_type sVar4;
  iterator local_58;
  _List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> local_50 [2];
  size_t r;
  size_t d;
  size_t n;
  size_t x;
  const_iterator it;
  uint8_t itemdatalength_local;
  SDES *this_local;
  
  it._M_node._7_1_ = itemdatalength;
  std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::_List_const_iterator
            ((_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> *)&x);
  n = 0;
  bVar1 = std::__cxx11::
          list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
          ::empty(&this->sdessources);
  if (bVar1) {
    this_local = (SDES *)0x0;
  }
  else {
    local_58._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
         ::begin(&this->sdessources);
    std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
    _List_const_iterator(local_50,&local_58);
    x = (size_t)local_50[0]._M_node;
    while( true ) {
      bVar1 = std::operator!=((_Self *)&x,&this->sdesit);
      if (!bVar1) break;
      ppSVar2 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::
                operator*((_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> *)
                          &x);
      sVar3 = SDESSource::NeededBytes(*ppSVar2);
      n = sVar3 + n;
      std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::operator++
                ((_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*> *)&x,0);
    }
    ppSVar2 = std::_List_const_iterator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>::operator*
                        (&this->sdesit);
    sVar3 = SDESSource::NeededBytesWithExtraItem(*ppSVar2,it._M_node._7_1_);
    n = sVar3 + n;
    sVar4 = std::__cxx11::
            list<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*,_std::allocator<jrtplib::RTCPCompoundPacketBuilder::SDESSource_*>_>
            ::size(&this->sdessources);
    r = sVar4 / 0x1f;
    if (sVar4 % 0x1f != 0) {
      r = r + 1;
    }
    this_local = (SDES *)(r * 4 + n);
  }
  return (size_t)this_local;
}

Assistant:

size_t NeededBytesWithExtraItem(uint8_t itemdatalength)
		{
			std::list<SDESSource *>::const_iterator it;
			size_t x = 0;
			size_t n,d,r;
			
			if (sdessources.empty())
				return 0;
			
			for (it = sdessources.begin() ; it != sdesit ; it++)
				x += (*it)->NeededBytes();
			x += (*sdesit)->NeededBytesWithExtraItem(itemdatalength);
			n = sdessources.size();
			d = n/31;
			r = n%31;
			if (r != 0)
				d++;
			x += d*sizeof(RTCPCommonHeader);
			return x;
		}